

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O3

Stream * rw::writeMaterialMatFX
                   (Stream *stream,int32 param_2,void *object,int32 offset,int32 param_5)

{
  uint32 *puVar1;
  uint32 uVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  bool bVar6;
  Texture *this;
  
  lVar3 = *(long *)((long)object + (long)offset);
  Stream::writeU32(stream,*(uint32 *)(lVar3 + 0x50));
  lVar5 = 0;
  bVar6 = true;
  do {
    puVar1 = (uint32 *)(lVar3 + lVar5 * 0x28);
    Stream::writeU32(stream,*puVar1);
    uVar2 = *puVar1;
    if (uVar2 == 4) {
      Stream::writeI32(stream,puVar1[4]);
      Stream::writeI32(stream,puVar1[5]);
      Stream::writeI32(stream,(uint)(*(long *)(puVar1 + 2) != 0));
      this = *(Texture **)(puVar1 + 2);
LAB_0013040f:
      if (this != (Texture *)0x0) {
        Texture::streamWrite(this,stream);
      }
    }
    else {
      if (uVar2 == 2) {
        Stream::writeF32(stream,(float32)puVar1[6]);
        Stream::writeI32(stream,puVar1[7]);
        Stream::writeI32(stream,(uint)(*(long *)(puVar1 + 4) != 0));
        this = *(Texture **)(puVar1 + 4);
        goto LAB_0013040f;
      }
      if (uVar2 == 1) {
        Stream::writeF32(stream,(float32)puVar1[8]);
        Stream::writeI32(stream,(uint)(*(long *)(puVar1 + 4) != 0));
        if (*(Texture **)(puVar1 + 4) != (Texture *)0x0) {
          Texture::streamWrite(*(Texture **)(puVar1 + 4),stream);
        }
        Stream::writeI32(stream,(uint)(*(long *)(puVar1 + 6) != 0));
        this = *(Texture **)(puVar1 + 6);
        goto LAB_0013040f;
      }
    }
    lVar5 = 1;
    bVar4 = !bVar6;
    bVar6 = false;
    if (bVar4) {
      return stream;
    }
  } while( true );
}

Assistant:

static Stream*
writeMaterialMatFX(Stream *stream, int32, void *object, int32 offset, int32)
{
	MatFX *matfx = *PLUGINOFFSET(MatFX*, object, offset);

	stream->writeU32(matfx->type);
	for(int i = 0; i < 2; i++){
		stream->writeU32(matfx->fx[i].type);
		switch(matfx->fx[i].type){
		case MatFX::BUMPMAP:
			stream->writeF32(matfx->fx[i].bump.coefficient);
			stream->writeI32(matfx->fx[i].bump.bumpedTex != nil);
			if(matfx->fx[i].bump.bumpedTex)
				matfx->fx[i].bump.bumpedTex->streamWrite(stream);
			stream->writeI32(matfx->fx[i].bump.tex != nil);
			if(matfx->fx[i].bump.tex)
				matfx->fx[i].bump.tex->streamWrite(stream);
			break;

		case MatFX::ENVMAP:
			stream->writeF32(matfx->fx[i].env.coefficient);
			stream->writeI32(matfx->fx[i].env.fbAlpha);
			stream->writeI32(matfx->fx[i].env.tex != nil);
			if(matfx->fx[i].env.tex)
				matfx->fx[i].env.tex->streamWrite(stream);
			break;

		case MatFX::DUAL:
			stream->writeI32(matfx->fx[i].dual.srcBlend);
			stream->writeI32(matfx->fx[i].dual.dstBlend);
			stream->writeI32(matfx->fx[i].dual.tex != nil);
			if(matfx->fx[i].dual.tex)
				matfx->fx[i].dual.tex->streamWrite(stream);
			break;
		}
	}
	return stream;
}